

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node * lyd_parse_fd_(ly_ctx *ctx,int fd,LYD_FORMAT format,int options,__va_list_tag *ap)

{
  int iVar1;
  char *local_48;
  char *data;
  size_t length;
  lyd_node *ret;
  __va_list_tag *ap_local;
  LYD_FORMAT local_20;
  int options_local;
  LYD_FORMAT format_local;
  int fd_local;
  ly_ctx *ctx_local;
  
  ret = (lyd_node *)ap;
  ap_local._4_4_ = options;
  local_20 = format;
  options_local = fd;
  _format_local = ctx;
  if ((ctx == (ly_ctx *)0x0) || (fd == -1)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_parse_fd_");
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    iVar1 = lyp_mmap(ctx,fd,0,(size_t *)&data,&local_48);
    if (iVar1 == 0) {
      if (local_48 == (char *)0x0) {
        ctx_local = (ly_ctx *)0x0;
      }
      else {
        length = (size_t)lyd_parse_data_(_format_local,local_48,local_20,ap_local._4_4_,
                                         (__va_list_tag *)ret);
        lyp_munmap(local_48,(size_t)data);
        ctx_local = (ly_ctx *)length;
      }
    }
    else {
      ly_log(_format_local,LY_LLERR,LY_ESYS,"Mapping file descriptor into memory failed (%s()).",
             "lyd_parse_fd_");
      ctx_local = (ly_ctx *)0x0;
    }
  }
  return (lyd_node *)ctx_local;
}

Assistant:

static struct lyd_node *
lyd_parse_fd_(struct ly_ctx *ctx, int fd, LYD_FORMAT format, int options, va_list ap)
{
    struct lyd_node *ret;
    size_t length;
    char *data;

    if (!ctx || (fd == -1)) {
        LOGARG;
        return NULL;
    }

    if (lyp_mmap(ctx, fd, 0, &length, (void **)&data)) {
        LOGERR(ctx, LY_ESYS, "Mapping file descriptor into memory failed (%s()).", __func__);
        return NULL;
    } else if (!data) {
        return NULL;
    }

    ret = lyd_parse_data_(ctx, data, format, options, ap);

    lyp_munmap(data, length);

    return ret;
}